

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::end_object
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  parse_state pVar1;
  byte bVar2;
  int iVar3;
  json_errc __e;
  json_errc local_20 [2];
  
  if (this->level_ < 1) {
    basic_json_parser<char,std::allocator<char>>::end_object();
  }
  else {
    pVar1 = pop_state(this);
    this->state_ = pVar1;
    if (pVar1 == array) {
      local_20[0] = expected_comma_or_rbracket;
      if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_00204b36;
      (*(this->err_handler_)._M_invoker)
                ((_Any_data *)&this->err_handler_,local_20,&this->super_ser_context);
      __e = expected_comma_or_rbracket;
    }
    else {
      if (pVar1 == object) {
        (*visitor->_vptr_basic_json_visitor[5])(visitor,this,ec);
        bVar2 = this->cursor_mode_ ^ 1;
        if (this->level_ == this->mark_level_) {
          bVar2 = false;
        }
        this->more_ = (bool)bVar2;
        iVar3 = this->level_ + -1;
        this->level_ = iVar3;
        if (iVar3 != 0) {
          this->state_ = expect_comma_or_end;
          return;
        }
        this->state_ = accept;
        return;
      }
      local_20[1] = 0x17;
      if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00204b36:
        std::__throw_bad_function_call();
      }
      (*(this->err_handler_)._M_invoker)
                ((_Any_data *)&this->err_handler_,local_20 + 1,&this->super_ser_context);
      __e = unexpected_rbrace;
    }
    std::error_code::operator=(ec,__e);
    this->more_ = false;
  }
  return;
}

Assistant:

void end_object(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(level_ < 1))
        {
            err_handler_(json_errc::unexpected_rbrace, *this);
            ec = json_errc::unexpected_rbrace;
            more_ = false;
            return;
        }
        state_ = pop_state();
        if (state_ == parse_state::object)
        {
            visitor.end_object(*this, ec);
        }
        else if (state_ == parse_state::array)
        {
            err_handler_(json_errc::expected_comma_or_rbracket, *this);
            ec = json_errc::expected_comma_or_rbracket;
            more_ = false;
            return;
        }
        else
        {
            err_handler_(json_errc::unexpected_rbrace, *this);
            ec = json_errc::unexpected_rbrace;
            more_ = false;
            return;
        }

        more_ = !cursor_mode_;
        if (level_ == mark_level_)
        {
            more_ = false;
        }
        --level_;
        if (level_ == 0)
        {
            state_ = parse_state::accept;
        }
        else
        {
            state_ = parse_state::expect_comma_or_end;
        }
    }